

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall DepsLog::RecordId(DepsLog *this,Node *node)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  uint uVar5;
  uint size;
  Node *node_local;
  uint checksum;
  
  iVar2 = (int)(node->path_)._M_string_length;
  uVar5 = -iVar2 & 3;
  size = iVar2 + uVar5 + 4;
  node_local = node;
  if (size < 0x80000) {
    bVar1 = OpenForWriteIfNeeded(this);
    if ((bVar1) && (sVar4 = fwrite(&size,4,1,(FILE *)this->file_), sVar4 != 0)) {
      sVar4 = fwrite((node->path_)._M_dataplus._M_p,(long)iVar2,1,(FILE *)this->file_);
      if (sVar4 == 0) {
        if ((node->path_)._M_string_length == 0) {
          __assert_fail("!node->path().empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                        ,0x184,"bool DepsLog::RecordId(Node *)");
        }
      }
      else if ((uVar5 == 0) || (sVar4 = fwrite("",(ulong)uVar5,1,(FILE *)this->file_), sVar4 != 0))
      {
        uVar5 = (uint)((ulong)((long)(this->nodes_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->nodes_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        checksum = ~uVar5;
        sVar4 = fwrite(&checksum,4,1,(FILE *)this->file_);
        if ((sVar4 != 0) && (iVar2 = fflush((FILE *)this->file_), iVar2 == 0)) {
          node->id_ = uVar5;
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->nodes_,&node_local);
          return true;
        }
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
  }
  return false;
}

Assistant:

bool DepsLog::RecordId(Node* node) {
  int path_size = node->path().size();
  int padding = (4 - path_size % 4) % 4;  // Pad path to 4 byte boundary.

  unsigned size = path_size + padding + 4;
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }

  if (!OpenForWriteIfNeeded()) {
    return false;
  }
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  if (fwrite(node->path().data(), path_size, 1, file_) < 1) {
    assert(!node->path().empty());
    return false;
  }
  if (padding && fwrite("\0\0", padding, 1, file_) < 1)
    return false;
  int id = nodes_.size();
  unsigned checksum = ~(unsigned)id;
  if (fwrite(&checksum, 4, 1, file_) < 1)
    return false;
  if (fflush(file_) != 0)
    return false;

  node->set_id(id);
  nodes_.push_back(node);

  return true;
}